

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  ImRect IVar7;
  ImGuiWindow *window;
  int i;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  ImGuiContext *g;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  int local_28;
  ImVec2 in_stack_ffffffffffffffe8;
  undefined1 restore_focus_to_window_under_popup;
  ImVec2 in_stack_fffffffffffffff0;
  
  pIVar3 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if ((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
           (pIVar5 = GetTopMostPopupModal(), pIVar5 == (ImGuiWindow *)0x0)) {
          FocusWindow(in_stack_ffffffffffffffd0);
        }
      }
      else {
        StartMouseMovingWindow(in_stack_ffffffffffffffd0);
        if ((((pIVar3->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) &&
           ((pIVar3->HoveredRootWindow->Flags & 1U) == 0)) {
          IVar7 = ImGuiWindow::TitleBarRect(in_stack_ffffffffffffffd0);
          auVar1._8_8_ = extraout_XMM0_Qb;
          auVar1._0_4_ = IVar7.Min.x;
          auVar1._4_4_ = IVar7.Min.y;
          in_stack_ffffffffffffffe8 = (ImVec2)vmovlpd_avx(auVar1);
          auVar2._8_8_ = in_XMM1_Qb;
          auVar2._0_4_ = IVar7.Max.x;
          auVar2._4_4_ = IVar7.Max.y;
          in_stack_fffffffffffffff0 = (ImVec2)vmovlpd_avx(auVar2);
          bVar4 = ImRect::Contains((ImRect *)&stack0xffffffffffffffe8,(pIVar3->IO).MouseClickedPos);
          if (((bVar4 ^ 0xffU) & 1) != 0) {
            pIVar3->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if (((pIVar3->IO).MouseClicked[1] & 1U) != 0) {
      pIVar5 = GetTopMostPopupModal();
      bVar4 = pIVar5 == (ImGuiWindow *)0x0;
      local_28 = (pIVar3->Windows).Size;
      while (restore_focus_to_window_under_popup = in_stack_ffffffffffffffe8.y._3_1_,
            local_28 = local_28 + -1, -1 < local_28 && !bVar4) {
        ppIVar6 = ImVector<ImGuiWindow_*>::operator[](&pIVar3->Windows,local_28);
        restore_focus_to_window_under_popup = in_stack_ffffffffffffffe8.y._3_1_;
        if (*ppIVar6 == pIVar5) break;
        if (*ppIVar6 == pIVar3->HoveredWindow) {
          bVar4 = true;
        }
      }
      ClosePopupsOverWindow
                ((ImGuiWindow *)in_stack_fffffffffffffff0,(bool)restore_focus_to_window_under_popup)
      ;
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}